

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

int xmlCharEncOutFunc(xmlCharEncodingHandler *handler,xmlBufferPtr out,xmlBufferPtr in)

{
  int val;
  uint uVar1;
  int local_74;
  int charrefLen;
  int cur;
  xmlChar *utf;
  uchar local_58 [4];
  int len;
  xmlChar charref [20];
  uint local_38;
  int local_34;
  int toconv;
  int writtentot;
  int written;
  int ret;
  xmlBufferPtr in_local;
  xmlBufferPtr out_local;
  xmlCharEncodingHandler *handler_local;
  
  local_34 = 0;
  if ((handler != (xmlCharEncodingHandler *)0x0) &&
     (_written = in, in_local = out, out_local = (xmlBufferPtr)handler, out != (xmlBufferPtr)0x0)) {
    while( true ) {
      do {
        toconv = in_local->size - in_local->use;
        if (0 < toconv) {
          toconv = toconv + -1;
        }
        if (_written == (xmlBufferPtr)0x0) {
          local_38 = 0;
          xmlEncOutputChunk((xmlCharEncodingHandler *)out_local,in_local->content + in_local->use,
                            &toconv,(uchar *)0x0,(int *)&local_38);
          in_local->use = toconv + in_local->use;
          in_local->content[in_local->use] = '\0';
          return 0;
        }
        local_38 = _written->use;
        if (toconv <= (int)(local_38 * 4)) {
          xmlBufferGrow(in_local,local_38 << 2);
          toconv = (in_local->size - in_local->use) + -1;
        }
        writtentot = xmlEncOutputChunk((xmlCharEncodingHandler *)out_local,
                                       in_local->content + in_local->use,&toconv,_written->content,
                                       (int *)&local_38);
        xmlBufferShrink(_written,local_38);
        in_local->use = toconv + in_local->use;
        local_74 = toconv + local_34;
        in_local->content[in_local->use] = '\0';
        local_34 = local_74;
      } while (writtentot == -3);
      if (writtentot != -2) {
        if (local_74 == 0) {
          local_74 = writtentot;
        }
        return local_74;
      }
      utf._4_4_ = _written->use;
      val = xmlGetUTF8Char(_written->content,(int *)((long)&utf + 4));
      if (val < 1) {
        return writtentot;
      }
      uVar1 = xmlSerializeDecCharRef((char *)local_58,val);
      xmlBufferShrink(_written,utf._4_4_);
      xmlBufferGrow(in_local,uVar1 << 2);
      toconv = (in_local->size - in_local->use) + -1;
      local_38 = uVar1;
      writtentot = xmlEncOutputChunk((xmlCharEncodingHandler *)out_local,
                                     in_local->content + in_local->use,&toconv,local_58,
                                     (int *)&local_38);
      if ((writtentot < 0) || (local_38 != uVar1)) break;
      in_local->use = toconv + in_local->use;
      local_34 = toconv + local_34;
      in_local->content[in_local->use] = '\0';
    }
  }
  return -1;
}

Assistant:

int
xmlCharEncOutFunc(xmlCharEncodingHandler *handler, xmlBufferPtr out,
                  xmlBufferPtr in) {
    int ret;
    int written;
    int writtentot = 0;
    int toconv;

    if (handler == NULL) return(XML_ENC_ERR_INTERNAL);
    if (out == NULL) return(XML_ENC_ERR_INTERNAL);

retry:

    written = out->size - out->use;

    if (written > 0)
	written--; /* Gennady: count '/0' */

    /*
     * First specific handling of in = NULL, i.e. the initialization call
     */
    if (in == NULL) {
        toconv = 0;
        /* TODO: Check return value. */
        xmlEncOutputChunk(handler, &out->content[out->use], &written,
                          NULL, &toconv);
        out->use += written;
        out->content[out->use] = 0;
        return(0);
    }

    /*
     * Conversion itself.
     */
    toconv = in->use;
    if (toconv * 4 >= written) {
        xmlBufferGrow(out, toconv * 4);
	written = out->size - out->use - 1;
    }
    ret = xmlEncOutputChunk(handler, &out->content[out->use], &written,
                            in->content, &toconv);
    xmlBufferShrink(in, toconv);
    out->use += written;
    writtentot += written;
    out->content[out->use] = 0;

    if (ret == XML_ENC_ERR_SPACE)
        goto retry;

    /*
     * Attempt to handle error cases
     */
    if (ret == XML_ENC_ERR_INPUT) {
        xmlChar charref[20];
        int len = in->use;
        const xmlChar *utf = (const xmlChar *) in->content;
        int cur, charrefLen;

        cur = xmlGetUTF8Char(utf, &len);
        if (cur <= 0)
            return(ret);

        /*
         * Removes the UTF8 sequence, and replace it by a charref
         * and continue the transcoding phase, hoping the error
         * did not mangle the encoder state.
         */
        charrefLen = xmlSerializeDecCharRef((char *) charref, cur);
        xmlBufferShrink(in, len);
        xmlBufferGrow(out, charrefLen * 4);
        written = out->size - out->use - 1;
        toconv = charrefLen;
        ret = xmlEncOutputChunk(handler, &out->content[out->use], &written,
                                charref, &toconv);
        if ((ret < 0) || (toconv != charrefLen))
            return(XML_ENC_ERR_INTERNAL);

        out->use += written;
        writtentot += written;
        out->content[out->use] = 0;
        goto retry;
    }
    return(writtentot ? writtentot : ret);
}